

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

int __thiscall
CVmObjDict::getp_correct(CVmObjDict *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  int iVar3;
  vm_obj_id_t vVar4;
  ulong uVar5;
  vm_dict_ext *pvVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  vm_val_t *this_00;
  CVmObject *this_01;
  char *str_00;
  vm_val_t *in_RDX;
  CVmObjDict *in_RDI;
  bool bVar7;
  CVmObjString *lstr;
  vm_obj_id_t lstr_id;
  size_t rplen;
  utf8_ptr rp;
  CVmObjList *sub;
  vm_obj_id_t sub_id;
  vm_val_t val;
  CVmObjList *lst;
  vm_obj_id_t lst_id;
  int i;
  corr_word *r;
  size_t matchlen;
  vmdict_TrieNode *chi;
  corr_word *w;
  corr_state *s;
  corr_word *results;
  corr_stack stk;
  size_t trunc_len;
  CVmObjStrComp *cmp;
  wchar_t *wstr;
  size_t wcnt;
  int max_dist;
  size_t strl;
  char *str;
  vmdict_TrieNode *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  corr_stack *in_stack_fffffffffffffee0;
  wchar_t *in_stack_fffffffffffffee8;
  wchar_t *src;
  corr_state *in_stack_fffffffffffffef0;
  undefined8 *in_stack_fffffffffffffef8;
  wchar_t *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  utf8_ptr in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  vm_val_t local_c8;
  CVmObject *local_b8;
  vm_obj_id_t local_b0;
  int local_ac;
  undefined8 *local_a8;
  ulong local_a0;
  vmdict_TrieNode *local_98;
  undefined8 *local_90;
  corr_state *local_88;
  undefined8 *local_80;
  corr_stack local_78;
  ulong local_70;
  CVmObject *local_68;
  wchar_t *local_60;
  size_t local_58;
  int local_3c;
  size_t local_38;
  char *local_30;
  vm_val_t *local_20;
  
  local_20 = in_RDX;
  if ((getp_correct(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar3 = __cxa_guard_acquire(&getp_correct(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar3 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_correct::desc,2);
    __cxa_guard_release(&getp_correct(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar3 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                     (uint *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     (CVmNativeCodeDesc *)in_stack_fffffffffffffec8);
  if (iVar3 == 0) {
    local_30 = CVmBif::pop_str_val();
    local_3c = CVmBif::pop_int_val();
    local_38 = vmb_get_len((char *)0x328408);
    local_30 = local_30 + 2;
    local_58 = utf8_ptr::to_wcharz(in_stack_fffffffffffffee8,(size_t)in_stack_fffffffffffffee0,
                                   (char *)CONCAT44(in_stack_fffffffffffffedc,
                                                    in_stack_fffffffffffffed8),
                                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_58 + 1;
    uVar5 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    local_60 = (wchar_t *)operator_new__(uVar5);
    utf8_ptr::to_wcharz(in_stack_fffffffffffffee8,(size_t)in_stack_fffffffffffffee0,
                        (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                        CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    local_68 = (CVmObject *)0x0;
    local_70 = 0;
    pvVar6 = get_ext(in_RDI);
    if (pvVar6->comparator_type_ == VMDICT_COMP_STRCOMP) {
      pvVar6 = get_ext(in_RDI);
      local_68 = pvVar6->comparator_obj_;
      iVar3 = (*local_68->_vptr_CVmObject[0x3e])();
      local_70 = CONCAT44(extraout_var,iVar3);
    }
    pvVar6 = get_ext(in_RDI);
    if (pvVar6->trie_ == (vmdict_TrieNode *)0x0) {
      build_trie((CVmObjDict *)in_stack_fffffffffffffef0);
    }
    get_ext(in_RDI);
    corr_stack::corr_stack
              (in_stack_fffffffffffffee0,
               (vmdict_TrieNode *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    local_80 = (undefined8 *)0x0;
    while (iVar3 = corr_stack::empty(&local_78), iVar3 == 0) {
      local_88 = corr_stack::pop(&local_78);
      if ((local_88->node->word_cnt != 0) && (local_88->ipos == local_58)) {
        local_90 = local_80;
        while ((local_90 != (undefined8 *)0x0 &&
               ((local_90[2] != local_88->strl ||
                (iVar3 = memcmp(local_90 + 3,local_88->str,local_88->strl << 2), iVar3 != 0))))) {
          local_90 = (undefined8 *)*local_90;
        }
        if (local_90 == (undefined8 *)0x0) {
          in_stack_fffffffffffffef8 =
               (undefined8 *)
               corr_word::operator_new
                         (CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                          (size_t)in_stack_fffffffffffffec8);
          corr_word::corr_word
                    ((corr_word *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                     (size_t)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                     in_stack_fffffffffffffed8,
                     (corr_word *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
          local_90 = in_stack_fffffffffffffef8;
          local_80 = in_stack_fffffffffffffef8;
        }
        if ((local_88->dist < *(int *)(local_90 + 1)) ||
           ((local_88->dist == *(int *)(local_90 + 1) &&
            (local_88->repl < *(int *)((long)local_90 + 0xc))))) {
          *(int *)(local_90 + 1) = local_88->dist;
          *(int *)((long)local_90 + 0xc) = local_88->repl;
        }
      }
      if (((local_88->dist < local_3c) && (local_88->ipos < local_58)) &&
         (local_88->typ != Deletion)) {
        in_stack_fffffffffffffec8 = local_88->node;
        in_stack_fffffffffffffed0 = 1;
        corr_stack::push((corr_stack *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                         ,in_stack_ffffffffffffff08,(size_t)in_RDI,
                         (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                         (int)in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0,
                         (vmdict_TrieNode *)in_stack_ffffffffffffff20.p_,
                         (corr_type)in_stack_ffffffffffffff28);
      }
      for (local_98 = local_88->node->chi; local_98 != (vmdict_TrieNode *)0x0;
          local_98 = local_98->nxt) {
        local_88->str[local_88->strl] = local_98->ch;
        local_a0 = 0;
        if (local_88->ipos < local_58) {
          if (local_68 == (CVmObject *)0x0) {
            local_a0 = (ulong)(local_60[local_88->ipos] == local_98->ch);
          }
          else {
            iVar3 = (*local_68->_vptr_CVmObject[0x3d])
                              (local_68,local_60 + local_88->ipos,local_58 - local_88->ipos,
                               (ulong)(uint)local_98->ch);
            local_a0 = CONCAT44(extraout_var_00,iVar3);
          }
          if (local_a0 != 0) {
            in_stack_fffffffffffffed0 = 0;
            in_stack_fffffffffffffec8 = local_98;
            corr_stack::push((corr_stack *)
                             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                             in_stack_ffffffffffffff08,(size_t)in_RDI,
                             (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                             (int)in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0,
                             (vmdict_TrieNode *)in_stack_ffffffffffffff20.p_,
                             (corr_type)in_stack_ffffffffffffff28);
          }
        }
        else if (((local_70 != 0) && (local_70 <= local_88->strl)) && (local_70 <= local_88->ipos))
        {
          in_stack_fffffffffffffed0 = 0;
          in_stack_fffffffffffffec8 = local_98;
          corr_stack::push((corr_stack *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff08,(size_t)in_RDI,
                           (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                           (int)in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0,
                           (vmdict_TrieNode *)in_stack_ffffffffffffff20.p_,
                           (corr_type)in_stack_ffffffffffffff28);
        }
        if (local_88->dist < local_3c) {
          if ((local_88->ipos < local_58) && (local_a0 == 0)) {
            in_stack_fffffffffffffed0 = 3;
            in_stack_fffffffffffffec8 = local_98;
            corr_stack::push((corr_stack *)
                             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                             in_stack_ffffffffffffff08,(size_t)in_RDI,
                             (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                             (int)in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0,
                             (vmdict_TrieNode *)in_stack_ffffffffffffff20.p_,
                             (corr_type)in_stack_ffffffffffffff28);
          }
          if (local_88->typ != Insertion) {
            in_stack_fffffffffffffed0 = 2;
            in_stack_fffffffffffffec8 = local_98;
            corr_stack::push((corr_stack *)
                             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                             in_stack_ffffffffffffff08,(size_t)in_RDI,
                             (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                             (int)in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0,
                             (vmdict_TrieNode *)in_stack_ffffffffffffff20.p_,
                             (corr_type)in_stack_ffffffffffffff28);
          }
        }
        if ((((local_88->typ == Replacement) && (local_88->ipos != 0)) &&
            (local_88->ipos < local_58)) &&
           ((local_60[local_88->ipos - 1] == local_98->ch &&
            (local_60[local_88->ipos] == local_88->str[local_88->strl - 1])))) {
          in_stack_fffffffffffffed0 = 4;
          in_stack_fffffffffffffec8 = local_98;
          corr_stack::push((corr_stack *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff08,(size_t)in_RDI,
                           (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                           (int)in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0,
                           (vmdict_TrieNode *)in_stack_ffffffffffffff20.p_,
                           (corr_type)in_stack_ffffffffffffff28);
        }
      }
      in_stack_fffffffffffffef0 = local_88;
      if (local_88 != (corr_state *)0x0) {
        corr_state::operator_delete((void *)0x328c25);
      }
    }
    src = local_60;
    if (local_60 != (wchar_t *)0x0) {
      operator_delete__(local_60);
    }
    local_ac = 0;
    for (local_a8 = local_80; local_a8 != (undefined8 *)0x0; local_a8 = (undefined8 *)*local_a8) {
      if (*(int *)(local_a8 + 1) != 0) {
        local_ac = local_ac + 1;
      }
    }
    local_b0 = CVmObjList::create(in_stack_fffffffffffffed4,(size_t)in_stack_fffffffffffffec8);
    local_b8 = vm_objp(0);
    CVmObjList::cons_clear
              ((CVmObjList *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    this_00 = CVmStack::push();
    vm_val_t::set_obj(this_00,local_b0);
    local_ac = 0;
    for (local_a8 = local_80; local_a8 != (undefined8 *)0x0; local_a8 = (undefined8 *)*local_a8) {
      if (*(int *)(local_a8 + 1) != 0) {
        vVar4 = CVmObjList::create(in_stack_fffffffffffffed4,(size_t)in_stack_fffffffffffffec8);
        vm_objp(0);
        vm_val_t::set_obj(&local_c8,vVar4);
        CVmObjList::cons_set_element
                  ((CVmObjList *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (size_t)in_stack_fffffffffffffec8,(vm_val_t *)0x328d71);
        utf8_ptr::utf8_ptr((utf8_ptr *)&stack0xffffffffffffff20);
        utf8_ptr::setwchars((utf8_ptr *)in_stack_fffffffffffffef0,src,
                            (size_t)in_stack_fffffffffffffee0,
                            CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        vVar4 = CVmObjString::create(in_stack_fffffffffffffed4,(size_t)in_stack_fffffffffffffec8);
        this_01 = vm_objp(0);
        str_00 = CVmObjString::cons_get_buf((CVmObjString *)this_01);
        utf8_ptr::set((utf8_ptr *)&stack0xffffffffffffff20,str_00);
        utf8_ptr::setwchars((utf8_ptr *)in_stack_fffffffffffffef0,src,
                            (size_t)in_stack_fffffffffffffee0,
                            CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        vm_val_t::set_obj(&local_c8,vVar4);
        CVmObjList::cons_set_element
                  ((CVmObjList *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (size_t)in_stack_fffffffffffffec8,(vm_val_t *)0x328e23);
        vm_val_t::set_int(&local_c8,*(int32_t *)(local_a8 + 1));
        CVmObjList::cons_set_element
                  ((CVmObjList *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (size_t)in_stack_fffffffffffffec8,(vm_val_t *)0x328e4c);
        vm_val_t::set_int(&local_c8,*(int32_t *)((long)local_a8 + 0xc));
        CVmObjList::cons_set_element
                  ((CVmObjList *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (size_t)in_stack_fffffffffffffec8,(vm_val_t *)0x328e75);
        local_ac = local_ac + 1;
      }
    }
    while (local_80 != (undefined8 *)0x0) {
      local_a8 = local_80;
      puVar1 = (undefined8 *)*local_80;
      bVar7 = local_80 != (undefined8 *)0x0;
      local_80 = puVar1;
      if (bVar7) {
        corr_word::operator_delete((void *)0x328eeb);
      }
    }
    vm_val_t::set_obj(local_20,local_b0);
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObjDict::getp_correct(VMG_ vm_obj_id_t self,
                             vm_val_t *retval, uint *argc)
{
    const char *str;
    size_t strl;
    int max_dist;
    static CVmNativeCodeDesc desc(2);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the word string and maximum edit distance */
    str = CVmBif::pop_str_val(vmg0_);
    max_dist = CVmBif::pop_int_val(vmg0_);

    /* get the string length and character pointer */
    strl = vmb_get_len(str);
    str += VMB_LEN;

    /* for easier processing, convert the string to a wchar_t array */
    size_t wcnt = utf8_ptr::to_wcharz(0, 0, str, strl);
    wchar_t *wstr = new wchar_t[wcnt+1];
    utf8_ptr::to_wcharz(wstr, wcnt+1, str, strl);

    /* if we have a StringComparator, fetch it */
    CVmObjStrComp *cmp = 0;
    size_t trunc_len = 0;
    if (get_ext()->comparator_type_ == VMDICT_COMP_STRCOMP)
    {
        /* get the comparator */
        cmp = (CVmObjStrComp *)get_ext()->comparator_obj_;

        /* note the truncation length */
        trunc_len = cmp->trunc_len();
    }

    /* if we don't have the Trie yet, build it */
    if (get_ext()->trie_ == 0)
        build_trie(vmg0_);

    /* create a stack with the initial empty state */
    corr_stack stk(get_ext()->trie_);

    /* start with an empty result list */
    corr_word *results = 0;

    /* process states until the stack is empty */
    while (!stk.empty())
    {
        /* pop the next state */
        corr_state *s = stk.pop();

        /* 
         *   Check for an 'accept' state.  This is a state where we've
         *   exhausted the input word, and we're at a Trie node that has at
         *   least one word defined.
         */
        if (s->node->word_cnt != 0 && s->ipos == wcnt)
        {
            /*
             *   We've found a matching word (i.e., a candidate dictionary
             *   match for the misspelled input word).  Scan the list of
             *   candidates we've already found to see if we've already
             *   matched this word.
             */
            corr_word *w;
            for (w = results ; w != 0 ; w = w->nxt)
            {
                if (w->strl == s->strl
                    && memcmp(w->str, s->str, s->strl*sizeof(wchar_t)) == 0)
                    break;
            }

            /* if we didn't find an entry, add a new one */
            if (w == 0)
                results = w = new (s->strl) corr_word(
                    s->str, s->strl, s->dist, s->repl, results);

            /* keep the lowest edit distance we've found so far */
            if (s->dist < w->dist
                || (s->dist == w->dist && s->repl < w->repl))
            {
                w->dist = s->dist;
                w->repl = s->repl;
            }
        }

        /*
         *   If we have any edit distance left, try an insertion (i.e., the
         *   input word has an extra letter relative to the dictionary word).
         *   Don't do insertions directly after deletions, though, since
         *   they'd just cancel out.  
         */
        if (s->dist < max_dist && s->ipos < wcnt && s->typ != Deletion)
            stk.push(s->str, s->strl, s->dist + 1, s->repl, s->ipos + 1,
                     s->node, Insertion);

        /* try each possible dictionary transition from here */
        for (vmdict_TrieNode *chi = s->node->chi ; chi != 0 ;
             chi = chi->nxt)
        {
            /* 
             *   Build the next-state string.  Note that we can just add the
             *   character directly to the current state's string buffer,
             *   since we always allocate state structures with one extra
             *   character of padding for just this purpose. 
             */
            s->str[s->strl] = chi->ch;

            /* 
             *   Check for a match to the current character.  If we have a
             *   StringComparator, ask the comparator to check the match.
             *   Otherwise just check for an exact character match. 
             */
            size_t matchlen = 0;
            if (s->ipos < wcnt)
            {
                if (cmp != 0)
                {
                    /* we have a comparator - check it for the match */
                    matchlen = cmp->match_chars(
                        wstr + s->ipos, wcnt - s->ipos, chi->ch);
                }
                else
                {
                    /* no comparator - do a simple character comparison */
                    if (wstr[s->ipos] == chi->ch)
                        matchlen = 1;
                }
                
                /* if we have a match, push a state for it */
                if (matchlen != 0)
                    stk.push(s->str, s->strl + 1, s->dist, s->repl,
                             s->ipos + matchlen, chi, NoChange);
            }
            else
            {
                /* 
                 *   we've reached the end of the input; but if the current
                 *   edit string is at least the truncation length in the
                 *   string comparator, consider this a character match as
                 *   well 
                 */
                if (trunc_len != 0
                    && s->strl >= trunc_len
                    && s->ipos >= trunc_len)
                    stk.push(s->str, s->strl + 1, s->dist, s->repl,
                             s->ipos, chi, NoChange);
            }

            /* if we have any edit distance remaining, try corrections */
            if (s->dist < max_dist)
            {
                /* try a replaced letter */
                if (s->ipos < wcnt && matchlen == 0)
                    stk.push(s->str, s->strl + 1, s->dist + 1, s->repl + 1,
                             s->ipos + 1, chi, Replacement);

                /* try a deletion (i.e., the input is missing a character) */
                if (s->typ != Insertion)
                    stk.push(s->str, s->strl + 1, s->dist + 1, s->repl,
                             s->ipos, chi, Deletion);
            }

            /* 
             *   if we just did a replacement edit, check to see if it's
             *   actually a transposition 
             */
            if (s->typ == Replacement
                && s->ipos > 0 && s->ipos < wcnt
                && wstr[s->ipos - 1] == chi->ch
                && wstr[s->ipos] == s->str[s->strl - 1])
                stk.push(s->str, s->strl + 1, s->dist, s->repl - 1,
                         s->ipos + 1, chi, Transposition);
        }

        /* we've finished processing the current state */
        delete s;
    }

    /* done with the wchar_t version of the word */
    delete [] wstr;

    /* 
     *   Count up the number of result entries.  Only count words with a
     *   non-zero edit distance - words with a zero edit distance are already
     *   matches for the input word, so we can't consider them to be
     *   corrections for it. 
     */
    corr_word *r;
    int i;
    for (r = results, i = 0 ; r != 0 ; r = r->nxt)
    {
        /* if this word has a non-zero edit distance, count it */
        if (r->dist != 0)
            ++i;
    }

    /* allocate a List to hold the results */
    vm_obj_id_t lst_id = CVmObjList::create(vmg_ FALSE, i);
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ lst_id);
    lst->cons_clear();

    /* push it for gc protection */
    G_stk->push()->set_obj(lst_id);

    /* create a List [word, distance] for each result */
    for (r = results, i = 0 ; r != 0 ; r = r->nxt)
    {
        vm_val_t val;

        /* 
         *   If this word has a zero edit distance, skip it.  A word with a
         *   zero edit distance is already a match for the original, so it
         *   can't be considered a correction.  
         */
        if (r->dist == 0)
            continue;
        
        /* create the sublist */
        vm_obj_id_t sub_id = CVmObjList::create(vmg_ FALSE, 3);
        CVmObjList *sub = (CVmObjList *)vm_objp(vmg_ sub_id);

        /* add it to the main list */
        val.set_obj(sub_id);
        lst->cons_set_element(i, &val);

        /* measure the utf8 space needed for the string */
        utf8_ptr rp;
        size_t rplen = rp.setwchars(r->str, r->strl, 0);

        /* create the word string */
        vm_obj_id_t lstr_id = CVmObjString::create(vmg_ FALSE, rplen);
        CVmObjString *lstr = (CVmObjString *)vm_objp(vmg_ lstr_id);

        /* encode it */
        rp.set(lstr->cons_get_buf());
        rp.setwchars(r->str, r->strl, rplen);

        /* add it to the sublist */
        val.set_obj(lstr_id);
        sub->cons_set_element(0, &val);

        /* add the edit distance */
        val.set_int(r->dist);
        sub->cons_set_element(1, &val);

        /* add the character replacement count */
        val.set_int(r->repl);
        sub->cons_set_element(2, &val);

        /* count it */
        ++i;
    }

    /* delete the result list */
    while (results != 0)
    {
        /* unlink this element */
        r = results;
        results = results->nxt;

        /* delete it */
        delete r;
    }

    /* return the list value */
    retval->set_obj(lst_id);

    /* done with the gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}